

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

bool __thiscall spv::Builder::isConstantOpCode(Builder *this,Op opcode)

{
  if (((OpSpecConstantOp < opcode) || ((0x1f7e0000000002U >> ((ulong)opcode & 0x3f) & 1) == 0)) &&
     (1 < opcode - OpConstantCompositeReplicateEXT)) {
    return false;
  }
  return true;
}

Assistant:

bool Builder::isConstantOpCode(Op opcode) const
{
    switch (opcode) {
    case OpUndef:
    case OpConstantTrue:
    case OpConstantFalse:
    case OpConstant:
    case OpConstantComposite:
    case OpConstantCompositeReplicateEXT:
    case OpConstantSampler:
    case OpConstantNull:
    case OpSpecConstantTrue:
    case OpSpecConstantFalse:
    case OpSpecConstant:
    case OpSpecConstantComposite:
    case OpSpecConstantCompositeReplicateEXT:
    case OpSpecConstantOp:
        return true;
    default:
        return false;
    }
}